

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O2

void uv__queue_done(uv__work *w,int err)

{
  _func_void_uv__work_ptr_int *p_Var1;
  undefined4 in_register_00000034;
  
  if ((w[-1].loop)->active_reqs == (void **)(w[-1].loop)->active_reqs[0]) {
    __assert_fail("uv__has_active_reqs(req->loop)",
                  "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/threadpool.c"
                  ,0xfc,"void uv__queue_done(struct uv__work *, int)");
  }
  p_Var1 = w[-2].done;
  (w[-2].loop)->data = p_Var1;
  *(uv_loop_s **)(p_Var1 + 8) = w[-2].loop;
  if ((code *)w[-1].wq[1] != (code *)0x0) {
    (*(code *)w[-1].wq[1])(w[-3].wq + 1,CONCAT44(in_register_00000034,err));
    return;
  }
  return;
}

Assistant:

static void uv__queue_done(struct uv__work* w, int err) {
  uv_work_t* req;

  req = container_of(w, uv_work_t, work_req);
  uv__req_unregister(req->loop, req);

  if (req->after_work_cb == NULL)
    return;

  req->after_work_cb(req, err);
}